

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  sqlite3 *db;
  Schema *pSVar1;
  char *zArg3;
  VTable *pVVar2;
  int iVar3;
  int iVar4;
  Table *pTable;
  VTable **ppVVar5;
  Vdbe *pVVar6;
  Schema **ppSVar7;
  long lVar8;
  char *pcVar9;
  uchar uVar10;
  uchar uVar11;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar3 = sqlite3ReadSchema(pParse), iVar3 != 0))
  goto LAB_0015d78d;
  if (noErr == 0) {
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    if (pTable == (Table *)0x0) goto LAB_0015d78d;
  }
  else {
    db->suppressErr = db->suppressErr + '\x01';
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    db->suppressErr = db->suppressErr + 0xff;
    if (pTable == (Table *)0x0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      goto LAB_0015d78d;
    }
  }
  if (pTable->pSchema == (Schema *)0x0) {
    iVar3 = -1000000;
  }
  else {
    iVar3 = -1;
    ppSVar7 = &db->aDb->pSchema;
    do {
      iVar3 = iVar3 + 1;
      pSVar1 = *ppSVar7;
      ppSVar7 = ppSVar7 + 4;
    } while (pSVar1 != pTable->pSchema);
  }
  if ((pTable->nModuleArg != 0) && (iVar4 = sqlite3ViewGetColumnNames(pParse,pTable), iVar4 != 0))
  goto LAB_0015d78d;
  pcVar9 = "sqlite_master";
  if (iVar3 == 1) {
    pcVar9 = "sqlite_temp_master";
  }
  zArg3 = db->aDb[iVar3].zDbSName;
  iVar4 = sqlite3AuthCheck(pParse,9,pcVar9,(char *)0x0,zArg3);
  if (iVar4 != 0) goto LAB_0015d78d;
  if (isView == 0) {
    if (pTable->nModuleArg == 0) {
      iVar4 = (uint)(iVar3 == 1) * 2 + 0xb;
      goto LAB_0015d88f;
    }
    ppVVar5 = &pTable->pVTable;
    do {
      pVVar2 = *ppVVar5;
      ppVVar5 = &pVVar2->pNext;
    } while (pVVar2->db != db);
    pcVar9 = pVVar2->pMod->zName;
    iVar4 = 0x1e;
  }
  else {
    iVar4 = (uint)(iVar3 != 1) * 2 + 0xf;
LAB_0015d88f:
    pcVar9 = (char *)0x0;
  }
  iVar4 = sqlite3AuthCheck(pParse,iVar4,pTable->zName,pcVar9,zArg3);
  if ((iVar4 != 0) ||
     (iVar4 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,zArg3), iVar4 != 0))
  goto LAB_0015d78d;
  pcVar9 = pTable->zName;
  if (pcVar9 != (char *)0x0) {
    lVar8 = 0;
    do {
      if ((ulong)(byte)pcVar9[lVar8] == 0) {
        uVar11 = ""[(byte)"sqlite_"[lVar8]];
        uVar10 = '\0';
LAB_0015d956:
        if (uVar10 != uVar11) goto LAB_0015d99f;
        break;
      }
      uVar10 = ""[(byte)pcVar9[lVar8]];
      uVar11 = ""[(byte)"sqlite_"[lVar8]];
      if (uVar10 != uVar11) goto LAB_0015d956;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 7);
    lVar8 = 0;
    do {
      if ((ulong)(byte)pcVar9[lVar8] == 0) {
        uVar11 = ""[(byte)"sqlite_stat"[lVar8]];
        uVar10 = '\0';
LAB_0015d997:
        if (uVar10 != uVar11) {
          pcVar9 = "table %s may not be dropped";
          goto LAB_0015da00;
        }
        break;
      }
      uVar10 = ""[(byte)pcVar9[lVar8]];
      uVar11 = ""[(byte)"sqlite_stat"[lVar8]];
      if (uVar10 != uVar11) goto LAB_0015d997;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xb);
  }
LAB_0015d99f:
  if (isView == 0) {
    if (pTable->pSelect == (Select *)0x0) goto LAB_0015d9c3;
    pcVar9 = "use DROP VIEW to delete view %s";
  }
  else {
    if (pTable->pSelect != (Select *)0x0) {
LAB_0015d9c3:
      pVVar6 = sqlite3GetVdbe(pParse);
      if (pVVar6 != (Vdbe *)0x0) {
        sqlite3BeginWriteOperation(pParse,1,iVar3);
        if (isView == 0) {
          sqlite3ClearStatTables(pParse,iVar3,"tbl",pTable->zName);
          sqlite3FkDropTable(pParse,pName,pTable);
        }
        sqlite3CodeDropTable(pParse,pTable,iVar3,(uint)(isView != 0));
      }
      goto LAB_0015d78d;
    }
    pcVar9 = "use DROP TABLE to delete table %s";
  }
LAB_0015da00:
  sqlite3ErrorMsg(pParse,pcVar9);
LAB_0015d78d:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}